

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O2

void __thiscall xe::ContainerFormatParser::advance(ContainerFormatParser *this)

{
  int iVar1;
  int offset;
  int iVar2;
  State SVar3;
  
  if (this->m_element != CONTAINERELEMENT_INCOMPLETE) {
    iVar2 = this->m_elementLen;
    (this->m_buf).m_back = ((this->m_buf).m_back + iVar2) % (this->m_buf).m_size;
    (this->m_buf).m_numElements = (this->m_buf).m_numElements - iVar2;
    this->m_element = CONTAINERELEMENT_INCOMPLETE;
    this->m_elementLen = 0;
    (this->m_attribute)._M_string_length = 0;
    *(this->m_attribute)._M_dataplus._M_p = '\0';
    (this->m_value)._M_string_length = 0;
    *(this->m_value)._M_dataplus._M_p = '\0';
  }
  SVar3 = this->m_state;
  iVar2 = this->m_elementLen;
LAB_001335e8:
  do {
    offset = iVar2;
    iVar1 = getChar(this,offset);
    if (iVar1 == -1) {
      if (SVar3 != STATE_DATA || offset < 1) {
        return;
      }
LAB_00133684:
      this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
      return;
    }
    iVar2 = offset + 1;
    this->m_elementLen = iVar2;
    if (iVar1 != 0xd) {
      if (iVar1 == 10) goto LAB_00133641;
      if (iVar1 == 0) {
        if (offset == 0) {
          this->m_element = CONTAINERELEMENT_END_OF_STRING;
          return;
        }
        if (SVar3 == STATE_CONTAINER_LINE) {
          parseContainerLine(this);
          return;
        }
        goto LAB_00133684;
      }
      if (SVar3 == STATE_AT_LINE_START) {
        SVar3 = (iVar1 != 0x23) + STATE_CONTAINER_LINE;
        this->m_state = SVar3;
        iVar2 = offset + 1;
      }
      goto LAB_001335e8;
    }
    iVar1 = getChar(this,iVar2);
    if ((iVar1 != -1) && (iVar1 != 10)) {
LAB_00133641:
      if (SVar3 == STATE_CONTAINER_LINE) {
        parseContainerLine(this);
      }
      else {
        this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
      }
      this->m_state = STATE_AT_LINE_START;
      return;
    }
  } while( true );
}

Assistant:

void ContainerFormatParser::advance (void)
{
	if (m_element != CONTAINERELEMENT_INCOMPLETE)
	{
		m_buf.popBack(m_elementLen);

		m_element		= CONTAINERELEMENT_INCOMPLETE;
		m_elementLen	= 0;
		m_attribute.clear();
		m_value.clear();
	}

	for (;;)
	{
		int curChar = getChar(m_elementLen);

		if (curChar != (int)END_OF_BUFFER)
			m_elementLen += 1;

		if (curChar == END_OF_STRING)
		{
			if (m_elementLen == 1)
				m_element = CONTAINERELEMENT_END_OF_STRING;
			else if (m_state == STATE_CONTAINER_LINE)
				parseContainerLine();
			else
				m_element = CONTAINERELEMENT_TEST_LOG_DATA;

			break;
		}
		else if (curChar == (int)END_OF_BUFFER)
		{
			if (m_elementLen > 0 && m_state == STATE_DATA)
				m_element = CONTAINERELEMENT_TEST_LOG_DATA;

			break;
		}
		else if (curChar == '\r' || curChar == '\n')
		{
			// Check for \r\n
			int nextChar = getChar(m_elementLen);
			if (curChar == '\n' || (nextChar != (int)END_OF_BUFFER && nextChar != '\n'))
			{
				if (m_state == STATE_CONTAINER_LINE)
					parseContainerLine();
				else
					m_element = CONTAINERELEMENT_TEST_LOG_DATA;

				m_state = STATE_AT_LINE_START;
				break;
			}
			// else handle following end or \n in next iteration.
		}
		else if (m_state == STATE_AT_LINE_START)
		{
			DE_ASSERT(m_elementLen == 1);
			m_state = (curChar == '#') ? STATE_CONTAINER_LINE : STATE_DATA;
		}
	}
}